

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  PGroup *pPVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  uint h;
  PCache1 *pOther;
  PgHdr1 *pPage;
  PGroup *pGroup;
  uint nPinned;
  int createFlag_local;
  uint iKey_local;
  PCache1 *pCache_local;
  
  pPVar1 = pCache->pGroup;
  pOther = (PCache1 *)0x0;
  uVar3 = pCache->nPage - pCache->nRecyclable;
  if ((createFlag == 1) &&
     (((pPVar1->mxPinned <= uVar3 || (pCache->n90pct <= uVar3)) ||
      ((iVar4 = pcache1UnderMemoryPressure(pCache), iVar4 != 0 && (pCache->nRecyclable < uVar3))))))
  {
    pCache_local = (PCache1 *)0x0;
  }
  else {
    if (pCache->nHash <= pCache->nPage) {
      pcache1ResizeHash(pCache);
    }
    if (((pCache->bPurgeable != 0) && (((pPVar1->lru).pLruPrev)->isAnchor == 0)) &&
       ((pCache->nMax <= pCache->nPage + 1 ||
        (iVar4 = pcache1UnderMemoryPressure(pCache), iVar4 != 0)))) {
      pOther = (PCache1 *)(pPVar1->lru).pLruPrev;
      pcache1RemoveFromHash((PgHdr1 *)pOther,0);
      pcache1PinPage((PgHdr1 *)pOther);
      if ((*(PCache1 **)&pOther->nMin)->szAlloc == pCache->szAlloc) {
        pPVar1->nPurgeable =
             pPVar1->nPurgeable - ((*(PCache1 **)&pOther->nMin)->bPurgeable - pCache->bPurgeable);
      }
      else {
        pcache1FreePage((PgHdr1 *)pOther);
        pOther = (PCache1 *)0x0;
      }
    }
    if (pOther == (PCache1 *)0x0) {
      pOther = (PCache1 *)pcache1AllocPage(pCache,(uint)(createFlag == 1));
    }
    if (pOther != (PCache1 *)0x0) {
      uVar3 = iKey % pCache->nHash;
      pCache->nPage = pCache->nPage + 1;
      pOther->szPage = iKey;
      *(PgHdr1 **)&pOther->szAlloc = pCache->apHash[uVar3];
      *(PCache1 **)&pOther->nMin = pCache;
      pOther->n90pct = 0;
      pOther->iMaxKey = 0;
      puVar2 = pOther->pnPurgeable;
      puVar2[0] = 0;
      puVar2[1] = 0;
      pCache->apHash[uVar3] = (PgHdr1 *)pOther;
      if (pCache->iMaxKey < iKey) {
        pCache->iMaxKey = iKey;
      }
    }
    pCache_local = pOther;
  }
  return (PgHdr1 *)pCache_local;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache, 
  unsigned int iKey, 
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( PAGE_IS_UNPINNED(pPage) );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nPurgeable -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found, 
  ** attempt to allocate a new one. 
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruNext = 0;
    /* pPage->pLruPrev = 0;
    ** No need to clear pLruPrev since it is not accessed when pLruNext==0 */
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}